

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddAbs.c
# Opt level: O3

int Cudd_bddVarIsDependent(DdManager *dd,DdNode *f,DdNode *var)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  
  pDVar6 = (DdNode *)((ulong)dd->one ^ 1);
  pDVar7 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
  if ((ulong)pDVar7->index == 0x7fffffff) {
    uVar3 = (uint)(pDVar6 == f);
  }
  else {
    uVar1 = dd->perm[pDVar7->index];
    uVar2 = dd->perm[var->index];
    uVar3 = 0;
    if (uVar1 <= uVar2) {
      pDVar5 = cuddCacheLookup2(dd,Cudd_bddVarIsDependent,f,var);
      if (pDVar5 == (DdNode *)0x0) {
        pDVar5 = (DdNode *)((ulong)(pDVar7->type).kids.T ^ (ulong)(pDVar7 != f));
        pDVar7 = (DdNode *)((ulong)(pDVar7 != f) ^ (ulong)(pDVar7->type).kids.E);
        if (uVar1 == uVar2) {
          uVar3 = Cudd_bddLeq(dd,pDVar5,(DdNode *)((ulong)pDVar7 ^ 1));
        }
        else {
          iVar4 = Cudd_bddVarIsDependent(dd,pDVar5,var);
          if (iVar4 == 0) {
            uVar3 = 0;
          }
          else {
            iVar4 = Cudd_bddVarIsDependent(dd,pDVar7,var);
            uVar3 = (uint)(iVar4 != 0);
          }
        }
        cuddCacheInsert2(dd,Cudd_bddVarIsDependent,f,var,
                         (DdNode *)((ulong)pDVar6 ^ (long)(int)uVar3));
      }
      else {
        uVar3 = (uint)(pDVar5 != pDVar6);
      }
    }
  }
  return uVar3;
}

Assistant:

int
Cudd_bddVarIsDependent(
  DdManager *dd,                /* manager */
  DdNode *f,                    /* function */
  DdNode *var                   /* variable */)
{
    DdNode *F, *res, *zero, *ft, *fe;
    unsigned topf, level;
    DD_CTFP cacheOp;
    int retval;

    zero = Cudd_Not(DD_ONE(dd));
    if (Cudd_IsConstant(f)) return(f == zero);

    /* From now on f is not constant. */
    F = Cudd_Regular(f);
    topf = (unsigned) dd->perm[F->index];
    level = (unsigned) dd->perm[var->index];

    /* Check terminal case. If topf > index of var, f does not depend on var.
    ** Therefore, var is not dependent in f. */
    if (topf > level) {
        return(0);
    }

    cacheOp = (DD_CTFP) Cudd_bddVarIsDependent;
    res = cuddCacheLookup2(dd,cacheOp,f,var);
    if (res != NULL) {
        return(res != zero);
    }

    /* Compute cofactors. */
    ft = Cudd_NotCond(cuddT(F), f != F);
    fe = Cudd_NotCond(cuddE(F), f != F);

    if (topf == level) {
        retval = Cudd_bddLeq(dd,ft,Cudd_Not(fe));
    } else {
        retval = Cudd_bddVarIsDependent(dd,ft,var) &&
            Cudd_bddVarIsDependent(dd,fe,var);
    }

    cuddCacheInsert2(dd,cacheOp,f,var,Cudd_NotCond(zero,retval));

    return(retval);

}